

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 gen_ldst(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_i32 val,ea_what what,
                 int index)

{
  int iVar1;
  TCGContext_conflict2 *pTVar2;
  TCGTemp *pTVar3;
  TCGContext_conflict2 *tcg_ctx;
  MemOp_conflict memop;
  TCGv_i32 val_00;
  
  if (what == EA_STORE) {
    pTVar2 = s->uc->tcg_ctx;
    tcg_gen_qemu_st_i32_m68k
              (pTVar2,val,addr,(ulong)(uint)index,
               *(MemOp_conflict *)(&DAT_00d7e480 + (long)opsize * 4));
    val_00 = pTVar2->store_dummy;
  }
  else {
    pTVar2 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_m68k(pTVar2,TCG_TYPE_I32,false);
    val_00 = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
    if (opsize == 2) {
      memop = MO_BEUL;
    }
    else if (opsize == 1) {
      memop = (uint)(what == EA_LOADS) * 4 + MO_BEUW;
    }
    else {
      memop = (uint)(what == EA_LOADS) << 2;
    }
    tcg_gen_qemu_ld_i32_m68k(pTVar2,val_00,addr,(ulong)(uint)index,memop);
    iVar1 = s->release_count;
    if (7 < (long)iVar1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                 ,0x91,"s->release_count < MAX_TO_RELEASE");
    }
    s->release_count = iVar1 + 1;
    s->release[iVar1] = val_00;
  }
  return val_00;
}

Assistant:

static TCGv gen_ldst(DisasContext *s, int opsize, TCGv addr, TCGv val,
                     ea_what what, int index)
{
    if (what == EA_STORE) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;
        gen_store(s, opsize, addr, val, index);
        return tcg_ctx->store_dummy;
    } else {
        return mark_to_release(s, gen_load(s, opsize, addr,
                                           what == EA_LOADS, index));
    }
}